

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

bool __thiscall spv::Builder::containsType(Builder *this,Id typeId,Op typeOp,uint width)

{
  bool bVar1;
  Op OVar2;
  uint uVar3;
  int iVar4;
  Id IVar5;
  Instruction *this_00;
  bool local_49;
  int local_38;
  int m;
  Op typeClass;
  Instruction *instr;
  uint width_local;
  Op typeOp_local;
  Id typeId_local;
  Builder *this_local;
  
  this_00 = Module::getInstruction(&this->module,typeId);
  OVar2 = spv::Instruction::getOpCode(this_00);
  switch(OVar2) {
  case OpTypeInt:
  case OpTypeFloat:
    local_49 = false;
    if (OVar2 == typeOp) {
      uVar3 = spv::Instruction::getImmediateOperand(this_00,0);
      local_49 = uVar3 == width;
    }
    this_local._7_1_ = local_49;
    break;
  case OpTypeVector:
  case OpTypeMatrix:
  case OpTypeArray:
  case OpTypeRuntimeArray:
    IVar5 = getContainedTypeId(this,typeId);
    this_local._7_1_ = containsType(this,IVar5,typeOp,width);
    break;
  default:
    this_local._7_1_ = OVar2 == typeOp;
    break;
  case OpTypeStruct:
    for (local_38 = 0; iVar4 = spv::Instruction::getNumOperands(this_00), local_38 < iVar4;
        local_38 = local_38 + 1) {
      IVar5 = spv::Instruction::getIdOperand(this_00,local_38);
      bVar1 = containsType(this,IVar5,typeOp,width);
      if (bVar1) {
        return true;
      }
    }
    this_local._7_1_ = false;
    break;
  case OpTypePointer:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Builder::containsType(Id typeId, spv::Op typeOp, unsigned int width) const
{
    const Instruction& instr = *module.getInstruction(typeId);

    Op typeClass = instr.getOpCode();
    switch (typeClass)
    {
    case OpTypeInt:
    case OpTypeFloat:
        return typeClass == typeOp && instr.getImmediateOperand(0) == width;
    case OpTypeStruct:
        for (int m = 0; m < instr.getNumOperands(); ++m) {
            if (containsType(instr.getIdOperand(m), typeOp, width))
                return true;
        }
        return false;
    case OpTypePointer:
        return false;
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return containsType(getContainedTypeId(typeId), typeOp, width);
    default:
        return typeClass == typeOp;
    }
}